

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O2

Result<std::shared_ptr<wasm::Module>_> * __thiscall
Shell::makeModule(Result<std::shared_ptr<wasm::Module>_> *__return_storage_ptr__,Shell *this,
                 WASTModule *mod)

{
  __index_type _Var1;
  int iVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  element_type *peVar3;
  undefined1 local_600 [8];
  WasmBinaryReader reader;
  __index_type local_5e0;
  string local_210 [8];
  stringstream ss;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> buffer;
  shared_ptr<wasm::Module> wasm;
  
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  _Var1 = (mod->super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>).
          super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
          super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
          super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
          super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
          super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
          ._M_index;
  if (_Var1 == '\x01') {
    std::__shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2> *)
               &buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (__shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2> *)mod);
  }
  else {
    if (_Var1 != '\0') {
      ::wasm::handle_unreachable
                ("unexpected module kind",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                 ,0x78);
    }
    std::make_shared<wasm::Module>();
    std::__shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2> *)
               &buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (__shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2> *)local_600);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reader);
    iVar2 = *(int *)&(mod->
                     super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     ).
                     super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     ._M_u;
    if (iVar2 == 0) {
      local_88._M_engaged = false;
      ::wasm::WATParser::parseModule
                (local_600,
                 buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 *(undefined8 *)
                  ((long)&(mod->
                          super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          ).
                          super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          ._M_u + 0x10),
                 *(undefined8 *)
                  ((long)&(mod->
                          super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          ).
                          super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          ._M_u + 8));
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_88);
      if (local_5e0 == '\x01') {
        std::__cxx11::string::string(local_210,(string *)local_600);
        std::__detail::__variant::_Variant_storage<false,std::shared_ptr<wasm::Module>,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,std::shared_ptr<wasm::Module>,wasm::Err> *)
                   __return_storage_ptr__,local_210);
        std::__cxx11::string::~string(local_210);
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_600);
        goto LAB_0013086d;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_600);
    }
    else if (iVar2 == 1) {
      __first._M_current =
           *(char **)((long)&(mod->
                             super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             ).
                             super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             .
                             super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             .
                             super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             .
                             super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             ._M_u + 8);
      std::vector<char,std::allocator<char>>::
      vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((vector<char,std::allocator<char>> *)local_40,__first,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(__first._M_current +
                   *(long *)((long)&(mod->
                                    super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    ).
                                    super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    ._M_u + 0x10)),(allocator_type *)local_600);
      ::wasm::WasmBinaryReader::WasmBinaryReader
                ((WasmBinaryReader *)local_600,
                 (Module *)
                 buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(FeatureSet)0x3fffff,(vector *)local_40,
                 (vector *)&::wasm::defaultEmptySourceMap);
      ::wasm::WasmBinaryReader::read();
      ::wasm::WasmBinaryReader::~WasmBinaryReader((WasmBinaryReader *)local_600);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)local_40);
    }
  }
  peVar3 = wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage[0x178] = -1;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage[0x179] = -1;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage[0x17a] = '?';
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage[0x17b] = '\0';
  *(pointer *)
   &(__return_storage_ptr__->val).super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> =
       buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  *(element_type **)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 8) = peVar3;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20) = '\0';
LAB_0013086d:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&wasm);
  return __return_storage_ptr__;
}

Assistant:

Result<std::shared_ptr<Module>> makeModule(WASTModule& mod) {
    std::shared_ptr<Module> wasm;
    if (auto* quoted = std::get_if<QuotedModule>(&mod)) {
      wasm = std::make_shared<Module>();
      switch (quoted->type) {
        case QuotedModuleType::Text: {
          CHECK_ERR(parseModule(*wasm, quoted->module));
          break;
        }
        case QuotedModuleType::Binary: {
          std::vector<char> buffer(quoted->module.begin(),
                                   quoted->module.end());
          WasmBinaryReader reader(*wasm, FeatureSet::All, buffer);
          try {
            reader.read();
          } catch (ParseException& p) {
            std::stringstream ss;
            p.dump(ss);
            return Err{ss.str()};
          }
          break;
        }
      }
    } else if (auto* ptr = std::get_if<std::shared_ptr<Module>>(&mod)) {
      wasm = *ptr;
    } else {
      WASM_UNREACHABLE("unexpected module kind");
    }
    wasm->features = FeatureSet::All;
    return wasm;
  }